

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O0

void receive_poll(PtTimestamp timestamp,void *userData)

{
  uint uVar1;
  long lVar2;
  int local_30;
  uint local_2c;
  int i;
  int data;
  int shift;
  PmEvent event;
  PmError count;
  void *userData_local;
  PtTimestamp timestamp_local;
  
  local_2c = 0;
  unique0x10000130 = userData;
  if (receive_poll_running != 0) {
    while (local_2c != 0xf7) {
      event.message = Pm_Read(receive_msg_midi_in,(PmEvent *)&data,1);
      if (event.message == 0) {
        return;
      }
      for (i = 0; i < 0x20 && local_2c != 0xf7; i = i + 8) {
        uVar1 = data >> ((byte)i & 0x1f);
        local_2c = uVar1 & 0xff;
        lVar2 = (long)receive_msg_index;
        receive_msg_index = receive_msg_index + 1;
        receive_msg[lVar2] = (uchar)uVar1;
        if (0x3ff < receive_msg_index) {
          printf("error: incoming sysex too long\n");
          goto LAB_00102fa6;
        }
      }
    }
    if (receive_msg_length == 0) {
      receive_msg_length = receive_msg_index;
    }
    if (receive_msg_length == receive_msg_index) {
      if (receive_msg[0] == 0xf0) {
        event.message = 0;
        for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
          event.message =
               ((uint)receive_msg[local_30 + 1] << ((char)local_30 * '\a' & 0x1fU)) + event.message;
        }
        if (receive_msg_count == -1) {
          receive_msg_count = event.message;
          receive_msg_messages = event.message;
        }
        if (receive_msg_count == event.message) {
          for (local_30 = 6; local_30 < receive_msg_index + -1; local_30 = local_30 + 1) {
            if ((uint)receive_msg[local_30] != local_30 % 0x80) {
              printf("error: incoming sysex has bad data\n");
              goto LAB_00102fa6;
            }
          }
          if (receive_msg[receive_msg_length + -1] == 0xf7) {
            receive_msg_index = 0;
            receive_msg_count = receive_msg_count + -1;
            return;
          }
        }
        else {
          printf("error: incoming sysex has wrong count\n");
        }
      }
      else {
        printf("error: incoming sysex missing status byte\n");
      }
    }
    else {
      printf("error: incoming sysex wrong length\n");
    }
LAB_00102fa6:
    receive_msg_error = 1;
  }
  return;
}

Assistant:

void receive_poll(PtTimestamp timestamp, void *userData)
{
    PmError count;
    PmEvent event;
    int shift;
    int data = 0;
    int i;
    
    if (!receive_poll_running) return; /* wait until midi device is opened */
    shift = 0;
    while (data != MIDI_EOX) {
        count = Pm_Read(receive_msg_midi_in, &event, 1);
        if (count == 0) return;

        /* compare 4 bytes of data until you reach an eox */
        for (shift = 0; shift < 32 && (data != MIDI_EOX); shift += 8) {
            receive_msg[receive_msg_index++] = data = 
                (event.message >> shift) & 0xFF;
            if (receive_msg_index >= MAX_MSG_LEN) {
                printf("error: incoming sysex too long\n");
                goto error;
            }
        }
    }
    /* check the message */
    if (receive_msg_length == 0) {
        receive_msg_length = receive_msg_index;
    }
    if (receive_msg_length != receive_msg_index) {
        printf("error: incoming sysex wrong length\n");
        goto error;
    }
    if (receive_msg[0] != MIDI_SYSEX) {
        printf("error: incoming sysex missing status byte\n");
        goto error;
    }
    /* get and check the count */
    count = 0;
    for (i = 0; i < 5; i++) {
        count += receive_msg[i + 1] << (7 * i);
    }
    if (receive_msg_count == -1) {
        receive_msg_count = count;
        receive_msg_messages = count;
    }
    if (receive_msg_count != count) {
        printf("error: incoming sysex has wrong count\n");
        goto error;
    }
    for (i = 6; i < receive_msg_index - 1; i++) {
        if (receive_msg[i] != i % 128) {
            printf("error: incoming sysex has bad data\n");
            goto error;
        }
    }
    if (receive_msg[receive_msg_length - 1] != MIDI_EOX) goto error;
    receive_msg_index = 0; /* get ready for next message */
    receive_msg_count--;
    return;
 error:
    receive_msg_error = 1;
    return;
}